

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_normalize_var(secp256k1_fe *r)

{
  uchar *puVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uchar *seckey;
  ulong uVar13;
  ulong uVar14;
  secp256k1_keypair *keypair;
  uint64_t uVar15;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx;
  uint uVar16;
  undefined1 auVar17 [16];
  secp256k1_scalar asStack_ec [15];
  secp256k1_ge sStack_b0;
  secp256k1_fe *psStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  
  secp256k1_fe_verify(r);
  uVar8 = (r->n[4] >> 0x30) * 0x1000003d1 + r->n[0];
  uVar10 = (uVar8 >> 0x34) + r->n[1];
  uVar8 = uVar8 & 0xfffffffffffff;
  uVar12 = (uVar10 >> 0x34) + r->n[2];
  uVar13 = (uVar12 >> 0x34) + r->n[3];
  uVar12 = uVar12 & 0xfffffffffffff;
  uVar15 = (uVar13 >> 0x34) + (r->n[4] & 0xffffffffffff);
  uVar11 = uVar10 & 0xfffffffffffff;
  uVar14 = uVar13 & 0xfffffffffffff;
  if (0xffffefffffc2e < uVar8 &&
      ((uVar12 & uVar10 & uVar13) == 0xfffffffffffff && uVar15 == 0xffffffffffff) ||
      uVar15 >> 0x30 != 0) {
    uVar11 = uVar11 + (uVar8 + 0x1000003d1 >> 0x34);
    uVar12 = uVar12 + (uVar11 >> 0x34);
    keypair = (secp256k1_keypair *)(uVar14 + (uVar12 >> 0x34));
    uVar10 = ((ulong)keypair >> 0x34) + uVar15;
    ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(uVar10 & 0x3000000000000);
    if (ecmult_gen_ctx != (secp256k1_ecmult_gen_context *)0x1000000000000) {
      secp256k1_fe_normalize_var_cold_1();
      uStack_38 = 0xfffffffffffff;
      uStack_40 = 0xffffffffffff;
      psStack_48 = r;
      if (ecmult_gen_ctx == (secp256k1_ecmult_gen_context *)0x0) {
        secp256k1_keypair_create_cold_4();
      }
      else if (keypair != (secp256k1_keypair *)0x0) {
        keypair->data[0x50] = '\0';
        keypair->data[0x51] = '\0';
        keypair->data[0x52] = '\0';
        keypair->data[0x53] = '\0';
        keypair->data[0x54] = '\0';
        keypair->data[0x55] = '\0';
        keypair->data[0x56] = '\0';
        keypair->data[0x57] = '\0';
        keypair->data[0x58] = '\0';
        keypair->data[0x59] = '\0';
        keypair->data[0x5a] = '\0';
        keypair->data[0x5b] = '\0';
        keypair->data[0x5c] = '\0';
        keypair->data[0x5d] = '\0';
        keypair->data[0x5e] = '\0';
        keypair->data[0x5f] = '\0';
        keypair->data[0x40] = '\0';
        keypair->data[0x41] = '\0';
        keypair->data[0x42] = '\0';
        keypair->data[0x43] = '\0';
        keypair->data[0x44] = '\0';
        keypair->data[0x45] = '\0';
        keypair->data[0x46] = '\0';
        keypair->data[0x47] = '\0';
        keypair->data[0x48] = '\0';
        keypair->data[0x49] = '\0';
        keypair->data[0x4a] = '\0';
        keypair->data[0x4b] = '\0';
        keypair->data[0x4c] = '\0';
        keypair->data[0x4d] = '\0';
        keypair->data[0x4e] = '\0';
        keypair->data[0x4f] = '\0';
        keypair->data[0x30] = '\0';
        keypair->data[0x31] = '\0';
        keypair->data[0x32] = '\0';
        keypair->data[0x33] = '\0';
        keypair->data[0x34] = '\0';
        keypair->data[0x35] = '\0';
        keypair->data[0x36] = '\0';
        keypair->data[0x37] = '\0';
        keypair->data[0x38] = '\0';
        keypair->data[0x39] = '\0';
        keypair->data[0x3a] = '\0';
        keypair->data[0x3b] = '\0';
        keypair->data[0x3c] = '\0';
        keypair->data[0x3d] = '\0';
        keypair->data[0x3e] = '\0';
        keypair->data[0x3f] = '\0';
        keypair->data[0x20] = '\0';
        keypair->data[0x21] = '\0';
        keypair->data[0x22] = '\0';
        keypair->data[0x23] = '\0';
        keypair->data[0x24] = '\0';
        keypair->data[0x25] = '\0';
        keypair->data[0x26] = '\0';
        keypair->data[0x27] = '\0';
        keypair->data[0x28] = '\0';
        keypair->data[0x29] = '\0';
        keypair->data[0x2a] = '\0';
        keypair->data[0x2b] = '\0';
        keypair->data[0x2c] = '\0';
        keypair->data[0x2d] = '\0';
        keypair->data[0x2e] = '\0';
        keypair->data[0x2f] = '\0';
        keypair->data[0x10] = '\0';
        keypair->data[0x11] = '\0';
        keypair->data[0x12] = '\0';
        keypair->data[0x13] = '\0';
        keypair->data[0x14] = '\0';
        keypair->data[0x15] = '\0';
        keypair->data[0x16] = '\0';
        keypair->data[0x17] = '\0';
        keypair->data[0x18] = '\0';
        keypair->data[0x19] = '\0';
        keypair->data[0x1a] = '\0';
        keypair->data[0x1b] = '\0';
        keypair->data[0x1c] = '\0';
        keypair->data[0x1d] = '\0';
        keypair->data[0x1e] = '\0';
        keypair->data[0x1f] = '\0';
        keypair->data[0] = '\0';
        keypair->data[1] = '\0';
        keypair->data[2] = '\0';
        keypair->data[3] = '\0';
        keypair->data[4] = '\0';
        keypair->data[5] = '\0';
        keypair->data[6] = '\0';
        keypair->data[7] = '\0';
        keypair->data[8] = '\0';
        keypair->data[9] = '\0';
        keypair->data[10] = '\0';
        keypair->data[0xb] = '\0';
        keypair->data[0xc] = '\0';
        keypair->data[0xd] = '\0';
        keypair->data[0xe] = '\0';
        keypair->data[0xf] = '\0';
        if (ecmult_gen_ctx->built == 0) {
          secp256k1_keypair_create_cold_2();
          return;
        }
        if (seckey == (uchar *)0x0) {
          secp256k1_keypair_create_cold_1();
          return;
        }
        iVar7 = secp256k1_ec_pubkey_create_helper(ecmult_gen_ctx,asStack_ec,&sStack_b0,seckey);
        secp256k1_keypair_save(keypair,asStack_ec,&sStack_b0);
        cVar6 = ((byte)iVar7 ^ 1) - 1;
        auVar17 = ZEXT216(CONCAT11(cVar6,cVar6));
        auVar17 = pshuflw(auVar17,auVar17,0);
        uVar16 = auVar17._0_4_;
        lVar9 = 0;
        do {
          puVar1 = keypair->data + lVar9;
          uVar3 = *(uint *)(puVar1 + 4);
          uVar4 = *(uint *)(puVar1 + 8);
          uVar5 = *(uint *)(puVar1 + 0xc);
          puVar2 = keypair->data + lVar9;
          *(uint *)puVar2 = *(uint *)puVar1 & uVar16;
          *(uint *)(puVar2 + 4) = uVar3 & uVar16;
          *(uint *)(puVar2 + 8) = uVar4 & uVar16;
          *(uint *)(puVar2 + 0xc) = uVar5 & uVar16;
          lVar9 = lVar9 + 0x10;
        } while (lVar9 != 0x60);
        return;
      }
      secp256k1_keypair_create_cold_3();
      return;
    }
    uVar14 = (ulong)keypair & 0xfffffffffffff;
    uVar12 = uVar12 & 0xfffffffffffff;
    uVar11 = uVar11 & 0xfffffffffffff;
    uVar8 = uVar8 + 0x1000003d1 & 0xfffffffffffff;
    uVar15 = uVar10 & 0xffffffffffff;
  }
  r->n[0] = uVar8;
  r->n[1] = uVar11;
  r->n[2] = uVar12;
  r->n[3] = uVar14;
  r->n[4] = uVar15;
  r->magnitude = 1;
  r->normalized = 1;
  secp256k1_fe_verify(r);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_normalize_var(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_normalize_var(r);
    r->magnitude = 1;
    r->normalized = 1;

    SECP256K1_FE_VERIFY(r);
}